

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test::TestBody
          (Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar1;
  double local_b8;
  AssertionResult gtest_ar;
  double local_a0;
  double newLowerBound;
  double newSamplingRate;
  double samplingRate;
  double lowerBound;
  GuaranteedThroughputProbabilisticSampler sampler;
  
  this_00 = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8;
  lowerBound = 2.0;
  samplingRate = 0.5;
  GuaranteedThroughputProbabilisticSampler::GuaranteedThroughputProbabilisticSampler
            (&sampler,2.0,0.5);
  newLowerBound = sampler._lowerBound;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"lowerBound","sampler.lowerBound()",&lowerBound,&newLowerBound);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&newLowerBound);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&newSamplingRate,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0xcb,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&newSamplingRate,(Message *)&newLowerBound);
LAB_001cf145:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newSamplingRate);
    this_00 = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&newLowerBound;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    newLowerBound = sampler._samplingRate;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"samplingRate","sampler.samplingRate()",&samplingRate,
               &newLowerBound);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&newLowerBound);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&newSamplingRate,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xcc,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&newSamplingRate,(Message *)&newLowerBound);
      goto LAB_001cf145;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    newLowerBound = 1.0;
    newSamplingRate = 0.6;
    jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update(1.0,0.6);
    local_b8 = sampler._lowerBound;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"newLowerBound","sampler.lowerBound()",&newLowerBound,&local_b8
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xd1,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_b8);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_b8 = sampler._samplingRate;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"newSamplingRate","sampler.samplingRate()",&newSamplingRate,
                 &local_b8);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        newSamplingRate = 1.1;
        jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update(newLowerBound,1.1)
        ;
        local_b8 = 1.0;
        local_a0 = sampler._samplingRate;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"1.0","sampler.samplingRate()",&local_b8,&local_a0);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_b8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0xd6,pcVar1);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_b8);
        }
        goto LAB_001cf161;
      }
      testing::Message::Message((Message *)&local_b8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xd2,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_b8);
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(this_00);
LAB_001cf161:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  GuaranteedThroughputProbabilisticSampler::~GuaranteedThroughputProbabilisticSampler(&sampler);
  return;
}

Assistant:

TEST(Sampler, testGuaranteedThroughputProbabilisticSamplerUpdate)
{
    auto lowerBound = 2.0;
    auto samplingRate = 0.5;
    GuaranteedThroughputProbabilisticSampler sampler(lowerBound, samplingRate);
    ASSERT_EQ(lowerBound, sampler.lowerBound());
    ASSERT_EQ(samplingRate, sampler.samplingRate());

    auto newLowerBound = 1.0;
    auto newSamplingRate = 0.6;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(newLowerBound, sampler.lowerBound());
    ASSERT_EQ(newSamplingRate, sampler.samplingRate());

    newSamplingRate = 1.1;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(1.0, sampler.samplingRate());
}